

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O1

void duckdb::Node4::ShrinkNode16(ART *art,Node *node4,Node *node16)

{
  byte *pbVar1;
  uint8_t uVar2;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var3;
  idx_t iVar4;
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *pBVar5;
  type paVar6;
  long *plVar7;
  pointer this;
  data_ptr_t pdVar8;
  __hash_code __code;
  ulong uVar9;
  ulong uVar10;
  long *plVar11;
  long lVar12;
  
  pBVar5 = BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(art,node4);
  uVar10 = (node16->super_IndexPointer).data;
  paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var3._M_head_impl =
       paVar6->_M_elems[3].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar9 = uVar10 & 0xffffffff;
  plVar7 = *(long **)(*(long *)&((_Var3._M_head_impl)->buffers)._M_h +
                     (uVar9 % *(size_type *)((long)&(_Var3._M_head_impl)->buffers + 8)) * 8);
  for (plVar11 = (long *)*plVar7; uVar9 != plVar11[1]; plVar11 = (long *)*plVar11) {
    plVar7 = plVar11;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar7 + 0x10));
  pdVar8 = FixedSizeBuffer::Get(this,true);
  lVar12 = (ulong)((uint)(uVar10 >> 0x20) & 0xffffff) * (_Var3._M_head_impl)->segment_size;
  iVar4 = (_Var3._M_head_impl)->bitmask_offset;
  pbVar1 = pdVar8 + iVar4 + lVar12;
  (node4->super_IndexPointer).data =
       (node16->super_IndexPointer).data & 0x8000000000000000 |
       (node4->super_IndexPointer).data & 0x7fffffffffffffff;
  uVar2 = pdVar8[iVar4 + lVar12];
  pBVar5->count = uVar2;
  if (uVar2 != '\0') {
    uVar10 = 0;
    do {
      pBVar5->key[uVar10] = pbVar1[uVar10 + 1];
      pBVar5->children[uVar10].super_IndexPointer.data = *(idx_t *)(pbVar1 + uVar10 * 8 + 0x18);
      uVar10 = uVar10 + 1;
    } while (uVar10 < *pbVar1);
  }
  *pbVar1 = 0;
  Node::Free(art,node16);
  return;
}

Assistant:

void Node4::ShrinkNode16(ART &art, Node &node4, Node &node16) {
	auto &n4 = New(art, node4);
	auto &n16 = Node::Ref<Node16>(art, node16, NType::NODE_16);
	node4.SetGateStatus(node16.GetGateStatus());

	n4.count = n16.count;
	for (uint8_t i = 0; i < n16.count; i++) {
		n4.key[i] = n16.key[i];
		n4.children[i] = n16.children[i];
	}

	n16.count = 0;
	Node::Free(art, node16);
}